

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O3

void xe::writeTestLog(BatchResult *result,ostream *stream)

{
  long *plVar1;
  int *piVar2;
  char cVar3;
  TestStatusCode code;
  pointer pcVar4;
  long *plVar5;
  int iVar6;
  ostream *poVar7;
  pointer pSVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  ConstTestCaseResultPtr caseData;
  long *local_50;
  long *local_48;
  long local_40 [2];
  
  if ((result->m_sessionInfo).releaseName._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo releaseName ",0x19);
    pcVar4 = (result->m_sessionInfo).releaseName._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,
               pcVar4 + (result->m_sessionInfo).releaseName._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).releaseId._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo releaseId ",0x17);
    pcVar4 = (result->m_sessionInfo).releaseId._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,
               pcVar4 + (result->m_sessionInfo).releaseId._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).targetName._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo targetName ",0x18);
    pcVar4 = (result->m_sessionInfo).targetName._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,
               pcVar4 + (result->m_sessionInfo).targetName._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).candyTargetName._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo candyTargetName ",0x1d);
    pcVar4 = (result->m_sessionInfo).candyTargetName._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,
               pcVar4 + (result->m_sessionInfo).candyTargetName._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).configName._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo configName ",0x18);
    pcVar4 = (result->m_sessionInfo).configName._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,
               pcVar4 + (result->m_sessionInfo).configName._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).resultName._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo resultName ",0x18);
    pcVar4 = (result->m_sessionInfo).resultName._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,
               pcVar4 + (result->m_sessionInfo).resultName._M_string_length);
    operator<<(stream,(ContainerValue *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if ((result->m_sessionInfo).timestamp._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"#sessionInfo timestamp ",0x17);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(result->m_sessionInfo).timestamp._M_dataplus._M_p,
                        (result->m_sessionInfo).timestamp._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"#beginSession\n",0xe);
  pSVar8 = (result->m_testCaseResults).
           super__Vector_base<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(result->m_testCaseResults).
                              super__Vector_base<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8) >> 4)) {
    lVar14 = 8;
    lVar13 = 0;
    do {
      plVar5 = *(long **)((long)pSVar8 + lVar14 + -8);
      local_48 = *(long **)((long)&pSVar8->m_ptr + lVar14);
      if (local_48 != (long *)0x0) {
        LOCK();
        *(int *)(local_48 + 1) = (int)local_48[1] + 1;
        UNLOCK();
        LOCK();
        *(int *)((long)local_48 + 0xc) = *(int *)((long)local_48 + 0xc) + 1;
        UNLOCK();
      }
      local_50 = plVar5;
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n#beginTestCaseResult ",0x16);
      pcVar12 = (char *)*plVar5;
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar12,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
      lVar11 = plVar5[9];
      iVar6 = (int)plVar5[10];
      if (iVar6 != (int)lVar11 && -1 < iVar6 - (int)lVar11) {
        lVar10 = 0;
        if (lVar11 != plVar5[10]) {
          lVar10 = lVar11;
        }
        std::ostream::write((char *)stream,lVar10);
        lVar11 = plVar5[9];
        lVar10 = 0;
        if (lVar11 != plVar5[10]) {
          lVar10 = lVar11;
        }
        cVar3 = *(char *)(lVar10 + (int)((int)plVar5[10] + ~(uint)lVar11));
        if ((cVar3 != '\n') && (cVar3 != '\r')) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
        }
      }
      code = *(TestStatusCode *)(plVar5 + 4);
      lVar11 = 0x13;
      if (code < TESTSTATUSCODE_LAST) {
        pcVar12 = "#endTestCaseResult\n";
        if ((0x2c00U >> (code & 0x1f) & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (stream,"#terminateTestCaseResult ",0x19);
          pcVar12 = getTestStatusCodeName(code);
          if (pcVar12 == (char *)0x0) {
            lVar11 = 1;
            std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
            pcVar12 = "\n";
          }
          else {
            sVar9 = strlen(pcVar12);
            lVar11 = 1;
            std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar12,sVar9);
            pcVar12 = "\n";
          }
        }
      }
      else {
        pcVar12 = "#endTestCaseResult\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar12,lVar11);
      plVar5 = local_48;
      if (local_48 != (long *)0x0) {
        LOCK();
        plVar1 = local_48 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        UNLOCK();
        if ((int)*plVar1 == 0) {
          local_50 = (long *)0x0;
          (**(code **)(*local_48 + 0x10))(local_48);
        }
        LOCK();
        piVar2 = (int *)((long)plVar5 + 0xc);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (local_48 != (long *)0x0)) {
          (**(code **)(*local_48 + 8))();
        }
      }
      lVar13 = lVar13 + 1;
      pSVar8 = (result->m_testCaseResults).
               super__Vector_base<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x10;
    } while (lVar13 < (int)((ulong)((long)(result->m_testCaseResults).
                                          super__Vector_base<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8)
                           >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n#endSession\n",0xd);
  return;
}

Assistant:

void writeTestLog (const BatchResult& result, std::ostream& stream)
{
	writeSessionInfo(result.getSessionInfo(), stream);

	stream << "#beginSession\n";

	for (int ndx = 0; ndx < result.getNumTestCaseResults(); ndx++)
	{
		ConstTestCaseResultPtr caseData = result.getTestCaseResult(ndx);
		writeTestCase(*caseData, stream);
	}

	stream << "\n#endSession\n";
}